

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleline.h
# Opt level: O2

void __thiscall
bandit::reporter::singleline::test_run_error(singleline *this,string *desc,test_run_error *err)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::endl<char,std::char_traits<char>>(local_190);
  poVar1 = std::operator<<(local_190,"Failed to run \"");
  progress_base::current_context_name_abi_cxx11_(&local_1c0,(progress_base *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\": error \"");
  pcVar2 = (char *)(**(code **)(*(long *)err + 0x10))(err);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\"");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_colored_base).super_progress_base.test_run_errors_,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void test_run_error(const std::string& desc, const detail::test_run_error& err) override {
        progress_base::test_run_error(desc, err);

        std::stringstream ss;
        ss << std::endl;
        ss << "Failed to run \"" << current_context_name() << "\": error \"" << err.what() << "\"" << std::endl;

        test_run_errors_.push_back(ss.str());
      }